

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

int mbedtls_timing_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  undefined1 local_84 [8];
  mbedtls_timing_delay_context ctx;
  uint32_t b;
  uint32_t a;
  mbedtls_timing_hr_time hires;
  int hardfail;
  unsigned_long secs;
  unsigned_long millisecs;
  unsigned_long ratio;
  unsigned_long cycles;
  int verbose_local;
  
  stack0xffffffffffffffd0 = 0;
  hires.opaque[0x18] = '\0';
  hires.opaque[0x19] = '\0';
  hires.opaque[0x1a] = '\0';
  hires.opaque[0x1b] = '\0';
  ctx.fin_ms = 0;
  ctx.int_ms = 0;
  if (verbose != 0) {
    printf("  TIMING tests note: will take some time!\n");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  stack0xffffffffffffffd0 = 1;
  mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,1);
  mbedtls_set_alarm((int)stack0xffffffffffffffd0);
  do {
  } while (mbedtls_timing_alarmed == 0);
  uVar3 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
  if ((uVar3 < (ulong)(stack0xffffffffffffffd0 * 800)) ||
     (stack0xffffffffffffffd0 * 0x4b0 + 300U < uVar3)) {
    if (verbose != 0) {
      printf("failed at line %d\n",0x1bf);
      printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,uVar3,
             stack0xffffffffffffffd0,(ulong)(uint)hires.opaque._24_4_,(ulong)ctx.fin_ms,
             (ulong)ctx.int_ms);
      uVar3 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
      uVar4 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)local_84,0);
      uVar1 = mbedtls_timing_get_delay(local_84);
      printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",uVar3,uVar4,(ulong)uVar1);
    }
    cycles._4_4_ = 1;
  }
  else {
    if (verbose != 0) {
      printf("passed\n");
      printf("  TIMING test #2 (set/get_delay        ): ");
    }
    ctx.fin_ms = 800;
    ctx.int_ms = 400;
    mbedtls_timing_set_delay(local_84,800,0x4b0);
    busy_msleep((ulong)(ctx.fin_ms - (ctx.fin_ms >> 2)));
    iVar2 = mbedtls_timing_get_delay(local_84);
    if (iVar2 == 0) {
      busy_msleep((ulong)((ctx.fin_ms >> 2) + (ctx.int_ms >> 2)));
      iVar2 = mbedtls_timing_get_delay(local_84);
      if (iVar2 == 1) {
        busy_msleep((ulong)ctx.int_ms);
        iVar2 = mbedtls_timing_get_delay(local_84);
        if (iVar2 == 2) {
          mbedtls_timing_set_delay(local_84,0,0);
          busy_msleep(200);
          iVar2 = mbedtls_timing_get_delay(local_84);
          if (iVar2 == -1) {
            if (verbose != 0) {
              printf("passed\n");
              printf("  TIMING test #3 (hardclock / get_timer): ");
            }
            for (; (int)hires.opaque._24_4_ < 2; hires.opaque._24_4_ = hires.opaque._24_4_ + 1) {
              uVar3 = mbedtls_timing_hardclock();
              busy_msleep(1);
              uVar4 = mbedtls_timing_hardclock();
              uVar5 = (uVar4 - uVar3) / 1;
              secs = 2;
              while( true ) {
                if (4 < secs) {
                  if (verbose != 0) {
                    printf("passed\n");
                  }
                  goto LAB_0012c373;
                }
                uVar3 = mbedtls_timing_hardclock();
                busy_msleep(secs);
                uVar4 = mbedtls_timing_hardclock();
                if (((uVar4 - uVar3) / secs < uVar5 - uVar5 / 5) ||
                   (uVar5 + uVar5 / 5 < (uVar4 - uVar3) / secs)) break;
                secs = secs + 1;
              }
            }
            if (verbose != 0) {
              printf("failed (ignored)\n");
            }
LAB_0012c373:
            if (verbose != 0) {
              printf(anon_var_dwarf_bdcb + 8);
            }
            cycles._4_4_ = 0;
          }
          else {
            if (verbose != 0) {
              printf("failed at line %d\n",0x1dd);
              printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,
                     uVar3,stack0xffffffffffffffd0,(ulong)(uint)hires.opaque._24_4_,
                     (ulong)ctx.fin_ms,(ulong)ctx.int_ms);
              uVar3 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
              uVar4 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)local_84,0);
              uVar1 = mbedtls_timing_get_delay(local_84);
              printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",uVar3,uVar4,
                     (ulong)uVar1);
            }
            cycles._4_4_ = 1;
          }
        }
        else {
          if (verbose != 0) {
            printf("failed at line %d\n",0x1d7);
            printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,
                   uVar3,stack0xffffffffffffffd0,(ulong)(uint)hires.opaque._24_4_,(ulong)ctx.fin_ms,
                   (ulong)ctx.int_ms);
            uVar3 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
            uVar4 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)local_84,0);
            uVar1 = mbedtls_timing_get_delay(local_84);
            printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",uVar3,uVar4,(ulong)uVar1)
            ;
          }
          cycles._4_4_ = 1;
        }
      }
      else {
        if (verbose != 0) {
          printf("failed at line %d\n",0x1d3);
          printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,uVar3,
                 stack0xffffffffffffffd0,(ulong)(uint)hires.opaque._24_4_,(ulong)ctx.fin_ms,
                 (ulong)ctx.int_ms);
          uVar3 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
          uVar4 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)local_84,0);
          uVar1 = mbedtls_timing_get_delay(local_84);
          printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",uVar3,uVar4,(ulong)uVar1);
        }
        cycles._4_4_ = 1;
      }
    }
    else {
      if (verbose != 0) {
        printf("failed at line %d\n",0x1cf);
        printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,uVar3,
               stack0xffffffffffffffd0,(ulong)(uint)hires.opaque._24_4_,(ulong)ctx.fin_ms,
               (ulong)ctx.int_ms);
        uVar3 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
        uVar4 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)local_84,0);
        uVar1 = mbedtls_timing_get_delay(local_84);
        printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",uVar3,uVar4,(ulong)uVar1);
      }
      cycles._4_4_ = 1;
    }
  }
  return cycles._4_4_;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles = 0, ratio = 0;
    unsigned long millisecs = 0, secs = 0;
    int hardfail = 0;
    struct mbedtls_timing_hr_time hires;
    uint32_t a = 0, b = 0;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    {
        secs = 1;

        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
            FAIL;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    {
        a = 800;
        b = 400;
        mbedtls_timing_set_delay( &ctx, a, a + b );          /* T = 0 */

        busy_msleep( a - a / 4 );                      /* T = a - a/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 0 )
            FAIL;

        busy_msleep( a / 4 + b / 4 );                  /* T = a + b/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 1 )
            FAIL;

        busy_msleep( b );                          /* T = a + b + b/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 2 )
            FAIL;
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}